

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O2

void __thiscall avro::StreamReader::skipBytes(StreamReader *this,size_t n)

{
  uint8_t *puVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar2;
  ulong uVar3;
  
  puVar1 = this->end_;
  uVar3 = (long)puVar1 - (long)this->next_;
  lVar2 = n - uVar3;
  if (uVar3 <= n && lVar2 != 0) {
    this->next_ = puVar1;
    UNRECOVERED_JUMPTABLE = this->in_->_vptr_InputStream[4];
    (*UNRECOVERED_JUMPTABLE)(this->in_,lVar2,puVar1,UNRECOVERED_JUMPTABLE);
    return;
  }
  this->next_ = this->next_ + n;
  return;
}

Assistant:

void skipBytes(size_t n) {
        if (n > static_cast<size_t>(end_ - next_)) {
            n -= end_ - next_;
            next_ = end_;
            in_->skip(n);
        } else {
            next_ += n;
        }
    }